

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArithmeticSubtermGeneralization.cpp
# Opt level: O1

Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> * __thiscall
Inferences::intersectSortedStack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>>>
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
           *__return_storage_ptr__,Inferences *this,
          Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *l,
          Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *r)

{
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar5;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *pSVar6;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  uint local_54;
  
  pMVar7 = *(Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(this + 8);
  pMVar5 = *(Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(this + 0x10);
  uVar4 = (long)pMVar5 - (long)pMVar7;
  pSVar6 = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)this;
  if (pMVar5 != pMVar7) {
    pMVar7 = l->_stack;
    pMVar5 = l->_cursor;
    pSVar6 = l;
    if (pMVar5 != pMVar7) {
      pSVar6 = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)this;
      if ((ulong)((long)pMVar5 - (long)pMVar7) < uVar4) {
        pSVar6 = l;
      }
      lVar8 = *(long *)(this + 8);
      uVar4 = 0;
      if (*(long *)(this + 0x10) != lVar8) {
        uVar3 = 0;
        uVar11 = 0;
        local_54 = 0;
        do {
          pMVar5 = l->_stack;
          uVar9 = ((long)l->_cursor - (long)pMVar5 >> 4) * -0x5555555555555555;
          if (uVar9 < uVar4 || uVar9 - uVar4 == 0) break;
          lVar10 = uVar3 * 0x30;
          if ((*(uint *)(lVar8 + 0x20 + lVar10) == pMVar5[uVar4].factors._id) &&
             (bVar2 = Kernel::RationalConstantType::operator==
                                ((RationalConstantType *)(lVar8 + lVar10),&pMVar5[uVar4].numeral),
             bVar2)) {
            lVar8 = *(long *)(this + 8);
            uVar3 = (ulong)local_54;
            local_54 = local_54 + 1;
            pMVar5 = pSVar6->_stack;
            mpz_set((__mpz_struct *)(pMVar5 + uVar3),(__mpz_struct *)(lVar8 + lVar10));
            lVar10 = lVar10 + lVar8;
            mpz_set(pMVar5[uVar3].numeral._den._val,(__mpz_struct *)(lVar10 + 0x10));
            pMVar1 = *(MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
                      (lVar10 + 0x28);
            *(undefined8 *)&pMVar5[uVar3].factors = *(undefined8 *)(lVar10 + 0x20);
            pMVar5[uVar3].factors._ptr = pMVar1;
            uVar11 = uVar11 + 1;
LAB_004a1852:
            uVar4 = (ulong)((int)uVar4 + 1);
          }
          else {
            bVar2 = Kernel::operator<((Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                                      (lVar10 + *(long *)(this + 8)),l->_stack + uVar4);
            if (!bVar2) goto LAB_004a1852;
            uVar11 = uVar11 + 1;
          }
          uVar3 = (ulong)uVar11;
          lVar8 = *(long *)(this + 8);
          uVar9 = (*(long *)(this + 0x10) - lVar8 >> 4) * -0x5555555555555555;
        } while (uVar3 <= uVar9 && uVar9 - uVar3 != 0);
        uVar4 = (ulong)local_54;
      }
      for (pMVar5 = pSVar6->_stack + uVar4; pMVar5 != pSVar6->_cursor; pMVar5 = pMVar5 + 1) {
        mpz_clear((pMVar5->numeral)._den._val);
        mpz_clear((__mpz_struct *)pMVar5);
      }
      pMVar7 = pSVar6->_stack;
      pMVar5 = pMVar7 + uVar4;
      pSVar6->_cursor = pMVar5;
    }
  }
  __return_storage_ptr__->_cursor = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  __return_storage_ptr__->_end = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  __return_storage_ptr__->_capacity = 0;
  __return_storage_ptr__->_stack = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  __return_storage_ptr__->_capacity = pSVar6->_capacity;
  pSVar6->_capacity = 0;
  __return_storage_ptr__->_cursor = pMVar5;
  pSVar6->_cursor = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  pMVar5 = __return_storage_ptr__->_end;
  __return_storage_ptr__->_end = pSVar6->_end;
  pSVar6->_end = pMVar5;
  pMVar5 = __return_storage_ptr__->_stack;
  __return_storage_ptr__->_stack = pMVar7;
  pSVar6->_stack = pMVar5;
  return __return_storage_ptr__;
}

Assistant:

Stack<C> intersectSortedStack(Stack<C>&& l, Stack<C>&& r) 
{
  // DEBUG("lhs: ", l)
  // DEBUG("rhs: ", r)

  if (l.size() == 0) return std::move(l);
  if (r.size() == 0) return std::move(r);

  unsigned outOffs = 0;
  auto& out = l.size() <= r.size() ? l : r;
  unsigned loffs = 0;
  unsigned roffs = 0;
  while (loffs < l.size() && roffs < r.size()) {
    if (l[loffs] == r[roffs]) {
      out[outOffs++] = l[loffs];
      loffs++;
      roffs++;
    } else if(l[loffs] < r[roffs]) {
      loffs++;
    } else {
      roffs++;
    }
  }
  
  out.truncate(outOffs);
  //DEBUG("out: ", out);
  return std::move(out);
}